

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::EvaluateSectionStrain
          (ChElementCableANCF *this,double eta,ChVector<double> *StrainV)

{
  int iVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorDynamic<> mD;
  ChVector<double> vr_x;
  ChVector<double> vr_xx;
  ShapeVector Ndd;
  ShapeVector Nd;
  ShapeVector N;
  ChMatrixNM<double,_3,_12> Sdd;
  ChMatrixNM<double,_3,_12> Sd;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3c0;
  ChVector<double> local_3b0;
  ChVector<double> local_398;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 *local_330;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_328;
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,700,
                  "virtual void chrono::fea::ChElementCableANCF::EvaluateSectionStrain(const double, ChVector<> &)"
                 );
  }
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1b]
  )(this,local_320);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1c]
  )((eta + 1.0) * 0.5,this,local_360);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1d]
  )(this,local_380);
  iVar1 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  local_3c0.m_storage.m_data = (double *)0x0;
  local_3c0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_3c0,(long)iVar1);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_3c0);
  local_330 = &local_300;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  vscatterdpd_avx512vl
            (ZEXT832(&local_1c0) + ZEXT1632(_DAT_00982b40) * (undefined1  [32])0x8,0xffff,local_360)
  ;
  vscatterdpd_avx512vl
            (ZEXT832(&local_1c0) + ZEXT832(0x68) + ZEXT1632(_DAT_00982b40) * (undefined1  [32])0x8,
             0xffff,local_360);
  auVar12 = ZEXT1632(_DAT_00982b40);
  vscatterdpd_avx512vl
            (ZEXT832(&local_1c0) + ZEXT832(0xd0) + auVar12 * (undefined1  [32])0x8,0xffff,local_360)
  ;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  local_280 = 0;
  uStack_278 = 0;
  uStack_270 = 0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  uStack_248 = 0;
  local_2c0 = 0;
  uStack_2b8 = 0;
  uStack_2b0 = 0;
  uStack_2a8 = 0;
  uStack_2a0 = 0;
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  local_300 = 0;
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uStack_2e0 = 0;
  uStack_2d8 = 0;
  uStack_2d0 = 0;
  uStack_2c8 = 0;
  vscatterdpd_avx512vl(ZEXT832(local_330) + auVar12 * (undefined1  [32])0x8,0xffff,local_380);
  vscatterdpd_avx512vl
            (ZEXT832(local_330) + ZEXT832(0x68) + auVar12 * (undefined1  [32])0x8,0xffff,local_380);
  vscatterdpd_avx512vl
            (ZEXT832(local_330) + ZEXT832(0xd0) + auVar12 * (undefined1  [32])0x8,0xffff,local_380);
  if (local_3c0.m_storage.m_rows == 0xc) {
    local_398.m_data[0] = (double)&local_1c0;
    local_398.m_data[1] = (double)&local_3c0;
    ChVector<double>::
    ChVector<Eigen::Product<Eigen::Matrix<double,3,12,1,3,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&local_3b0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_398,(type *)0x0);
    if (local_3c0.m_storage.m_rows == 0xc) {
      local_328 = &local_3c0;
      ChVector<double>::
      ChVector<Eigen::Product<Eigen::Matrix<double,3,12,1,3,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                (&local_398,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_330,(type *)0x0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_3b0.m_data[2];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_398.m_data[1];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_3b0.m_data[0];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_3b0.m_data[1];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_398.m_data[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_398.m_data[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_398.m_data[1] * local_3b0.m_data[2];
      auVar6 = vfmsub231sd_fma(auVar17,auVar4,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_398.m_data[2] * local_3b0.m_data[0];
      auVar7 = vfmsub231sd_fma(auVar9,auVar13,auVar14);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_3b0.m_data[1] * local_3b0.m_data[1];
      auVar4 = vfmadd231sd_fma(auVar5,auVar3,auVar3);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_398.m_data[0] * local_3b0.m_data[1];
      auVar3 = vfmsub231sd_fma(auVar15,auVar3,auVar16);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar7._0_8_ * auVar7._0_8_;
      auVar6 = vfmadd231sd_fma(auVar10,auVar6,auVar6);
      auVar7 = vfmadd231sd_fma(auVar4,auVar13,auVar13);
      auVar4 = vfmadd231sd_fma(auVar6,auVar3,auVar3);
      auVar4 = vsqrtsd_avx(auVar4,auVar4);
      auVar6 = vsqrtsd_avx(auVar7,auVar7);
      dVar2 = pow(auVar6._0_8_,3.0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_3b0.m_data[0];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_3b0.m_data[1] * local_3b0.m_data[1];
      auVar6 = vfmadd231sd_fma(auVar11,auVar6,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_3b0.m_data[2];
      auVar6 = vfmadd213sd_fma(auVar7,auVar7,auVar6);
      StrainV->m_data[0] = auVar6._0_8_ + -1.0;
      StrainV->m_data[1] = auVar4._0_8_ / dVar2;
      if (local_3c0.m_storage.m_data != (double *)0x0) {
        free((void *)local_3c0.m_storage.m_data[-1]);
      }
      return;
    }
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, 3, 12, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 3, 12, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementCableANCF::EvaluateSectionStrain(const double eta, ChVector<>& StrainV) {
    assert(section);

    ShapeVector N;
    ShapeVector Nd;
    ShapeVector Ndd;
    // double xi = (eta*2 - 1.0);
    double xi = (eta + 1.0) / 2.0;

    this->ShapeFunctions(N, xi);  // Evaluate shape functions
    this->ShapeFunctionsDerivatives(Nd, xi);
    this->ShapeFunctionsDerivatives2(Ndd, xi);
    ChVectorDynamic<> mD(GetNdofs());

    this->GetStateBlock(mD);

    ChMatrixNM<double, 3, 12> Sd;
    Sd.setZero();
    for (int i = 0; i < 4; i++) {
        Sd(0, 3 * i + 0) = Nd(i);
        Sd(1, 3 * i + 1) = Nd(i);
        Sd(2, 3 * i + 2) = Nd(i);
    }

    ChMatrixNM<double, 3, 12> Sdd;
    Sdd.setZero();
    for (int i = 0; i < 4; i++) {
        Sdd(0, 3 * i + 0) = Ndd(i);
        Sdd(1, 3 * i + 1) = Ndd(i);
        Sdd(2, 3 * i + 2) = Ndd(i);
    }

    ChVector<> vr_x(Sd * mD);
    ChVector<> vr_xx(Sdd * mD);
    ChVector<> vf1 = Vcross(vr_x, vr_xx);
    double f = vf1.Length();
    double g1 = vr_x.Length();
    double g = pow(g1, 3);

    StrainV.x() = vr_x.Length2() - 1.0;
    StrainV.y() = f / g;  // Bending strain measure (Gertmayer and Shabana, 2006)
}